

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbutton.cpp
# Opt level: O0

int __thiscall
QtMWidgets::NavigationButtonPrivate::init(NavigationButtonPrivate *this,EVP_PKEY_CTX *ctx)

{
  QPalette *this_00;
  QColor *pQVar1;
  NavigationButtonPrivate *this_local;
  
  QWidget::setSizePolicy((QWidget *)this->q,Expanding,Fixed);
  QWidget::setAutoFillBackground(SUB81(this->q,0));
  QWidget::setBackgroundRole((ColorRole)this->q);
  this_00 = (QPalette *)QWidget::palette();
  pQVar1 = QPalette::color(this_00,Highlight);
  *(undefined8 *)&this->baseColor = *(undefined8 *)pQVar1;
  *(undefined4 *)((long)&(this->baseColor).ct + 4) = *(undefined4 *)((long)&pQVar1->ct + 4);
  (this->baseColor).ct.argb.pad = (pQVar1->ct).argb.pad;
  *(undefined8 *)&this->color = *(undefined8 *)&this->baseColor;
  *(undefined4 *)((long)&(this->color).ct + 4) = *(undefined4 *)((long)&(this->baseColor).ct + 4);
  (this->color).ct.argb.pad = (this->baseColor).ct.argb.pad;
  *(undefined8 *)&this->textColor = *(undefined8 *)&this->baseColor;
  *(undefined4 *)((long)&(this->textColor).ct + 4) =
       *(undefined4 *)((long)&(this->baseColor).ct + 4);
  (this->textColor).ct.argb.pad = (this->baseColor).ct.argb.pad;
  return (int)this;
}

Assistant:

void
NavigationButtonPrivate::init()
{
	q->setSizePolicy( QSizePolicy::Expanding, QSizePolicy::Fixed );
	q->setAutoFillBackground( true );
	q->setBackgroundRole( QPalette::Base );

	baseColor = q->palette().color( QPalette::Highlight );
	color = baseColor;
	textColor = baseColor;
}